

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O2

int __thiscall Activation::remove(Activation *this,char *__filename)

{
  pointer pFVar1;
  iterator iVar2;
  
  pFVar1 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((ulong)__filename & 0xffffffff) <
      (ulong)((long)(this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 5)) {
    iVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::erase
                      (&this->m_params,pFVar1 + ((ulong)__filename & 0xffffffff));
    return (int)iVar2._M_current;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [activation removal]: Index out of bounds!\n");
  exit(1);
}

Assistant:

void Activation::remove(unsigned index){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation removal]: Index out of bounds!\n";
        exit(1);
    }

    m_params.erase(m_params.begin()+index);
}